

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_boost::random::detail::M3<-21>,_boost::random::detail::M3<6>,_boost::random::detail::M0,_boost::random::detail::M3<-13>,_boost::random::detail::M3<13>,_boost::random::detail::M2<-10>,_boost::random::detail::M2<-5>,_boost::random::detail::M3<13>,_boost::random::detail::no_tempering>,_3076024310U>
     ::run(void)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_258;
  basic_cstring<const_char> local_248;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_238;
  assertion_result local_218;
  basic_cstring<const_char> local_200;
  basic_cstring<const_char> local_1f0;
  basic_cstring<const_char> local_1e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1d0;
  basic_cstring<const_char> local_1a8;
  basic_cstring<const_char> local_198;
  undefined4 local_188;
  result_type local_184;
  basic_cstring<const_char> local_180;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_170;
  basic_cstring<const_char> local_148;
  basic_cstring<const_char> local_138;
  undefined4 local_128;
  result_type local_124;
  basic_cstring<const_char> local_120;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_110;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  undefined4 local_c4;
  result_type local_c0 [4];
  basic_cstring<const_char> local_b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_a0;
  basic_cstring<const_char> local_78;
  basic_cstring<const_char> local_68;
  undefined1 local_58 [8];
  WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_boost::random::detail::M3<_21>,_boost::random::detail::M3<6>,_boost::random::detail::M0,_boost::random::detail::M3<_13>,_boost::random::detail::M3<13>,_boost::random::detail::M2<_10>,_boost::random::detail::M2<_5>,_boost::random::detail::M3<13>,_boost::random::detail::no_tempering>,_3076024310U>
  c;
  
  WellTestCase((WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_boost::random::detail::M3<_21>,_boost::random::detail::M3<6>,_boost::random::detail::M0,_boost::random::detail::M3<_13>,_boost::random::detail::M3<13>,_boost::random::detail::M2<_10>,_boost::random::detail::M2<_5>,_boost::random::detail::M3<13>,_boost::random::detail::no_tempering>,_3076024310U>
                *)local_58);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_78);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_68,0x43,&local_78);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_a0,plVar3,(char (*) [1])0x15b00a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    local_c0[0] = generate((WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_boost::random::detail::M3<_21>,_boost::random::detail::M3<6>,_boost::random::detail::M0,_boost::random::detail::M3<_13>,_boost::random::detail::M3<13>,_boost::random::detail::M2<_10>,_boost::random::detail::M2<_5>,_boost::random::detail::M3<13>,_boost::random::detail::no_tempering>,_3076024310U>
                            *)local_58);
    local_c4 = 0xb75867f6;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_a0,&local_b0,0x43,1,2,local_c0,"c.generate()",&local_c4,"Expected");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_a0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d8,0x44,&local_e8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_110,plVar3,(char (*) [1])0x15b00a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    local_124 = boost::random::
                well_engine<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_boost::random::detail::M3<-21>,_boost::random::detail::M3<6>,_boost::random::detail::M0,_boost::random::detail::M3<-13>,_boost::random::detail::M3<13>,_boost::random::detail::M2<-10>,_boost::random::detail::M2<-5>,_boost::random::detail::M3<13>,_boost::random::detail::no_tempering>
                ::min();
    local_128 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_110,&local_120,0x44,1,2,&local_124,"c.rng.min()",&local_128,"0U");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_110);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_148);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_138,0x45,&local_148);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_170,plVar3,(char (*) [1])0x15b00a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_180,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    local_184 = boost::random::
                well_engine<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_boost::random::detail::M3<-21>,_boost::random::detail::M3<6>,_boost::random::detail::M0,_boost::random::detail::M3<-13>,_boost::random::detail::M3<13>,_boost::random::detail::M2<-10>,_boost::random::detail::M2<-5>,_boost::random::detail::M3<13>,_boost::random::detail::no_tempering>
                ::max();
    local_188 = 0xffffffff;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_170,&local_180,0x45,1,2,&local_184,"c.rng.max()",&local_188,"~0U");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_170);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_198,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_198,0x46,&local_1a8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1d0,plVar3,(char (*) [1])0x15b00a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::random::well_engine<unsigned_int,32ul,17ul,23ul,11ul,10ul,7ul,boost::random::detail::M3<_21>,boost::random::detail::M3<6>,boost::random::detail::M0,boost::random::detail::M3<_13>,boost::random::detail::M3<13>,boost::random::detail::M2<_10>,boost::random::detail::M2<_5>,boost::random::detail::M3<13>,boost::random::detail::no_tempering>,boost::random::well_engine<unsigned_int,32ul,17ul,23ul,11ul,10ul,7ul,boost::random::detail::M3<_21>,boost::random::detail::M3<6>,boost::random::detail::M0,boost::random::detail::M3<_13>,boost::random::detail::M3<13>,boost::random::detail::M2<_10>,boost::random::detail::M2<_5>,boost::random::detail::M3<13>,boost::random::detail::no_tempering>>
              (&local_1d0,&local_1e0,0x46,1,2,local_58,"c.rng",local_58,"c.rng");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_200);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1f0,0x47,&local_200);
    bVar2 = boost::random::operator==
                      ((well_engine<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_boost::random::detail::M3<_21>,_boost::random::detail::M3<6>,_boost::random::detail::M0,_boost::random::detail::M3<_13>,_boost::random::detail::M3<13>,_boost::random::detail::M2<_10>,_boost::random::detail::M2<_5>,_boost::random::detail::M3<13>,_boost::random::detail::no_tempering>
                        *)local_58,
                       (well_engine<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_boost::random::detail::M3<_21>,_boost::random::detail::M3<6>,_boost::random::detail::M0,_boost::random::detail::M3<_13>,_boost::random::detail::M3<13>,_boost::random::detail::M2<_10>,_boost::random::detail::M2<_5>,_boost::random::detail::M3<13>,_boost::random::detail::no_tempering>
                        *)local_58);
    boost::test_tools::assertion_result::assertion_result(&local_218,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_248,"c.rng == c.rng",0xe);
    boost::unit_test::operator<<(&local_238,plVar3,&local_248);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_258,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion(&local_218,&local_238,&local_258,0x47,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_238);
    boost::test_tools::assertion_result::~assertion_result(&local_218);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

static void run()
    {
        WellTestCase c;

        BOOST_CHECK_EQUAL(c.generate(), Expected);
        BOOST_CHECK_EQUAL(c.rng.min(), 0U);
        BOOST_CHECK_EQUAL(c.rng.max(), ~0U);
        BOOST_CHECK_EQUAL(c.rng, c.rng);
        BOOST_CHECK(c.rng == c.rng);
    }